

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void * nk_draw_vertex(void *dst,nk_convert_config *config,nk_vec2 pos,nk_vec2 uv,nk_colorf color)

{
  nk_draw_vertex_layout_attribute nVar1;
  nk_draw_vertex_layout_format value_count;
  nk_color nVar2;
  ulong in_RCX;
  void *dst0;
  nk_vec2 *values;
  nk_uint *pnVar3;
  nk_draw_vertex_layout_element *pnVar4;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar12;
  uint uVar13;
  float fVar14;
  uint uVar15;
  float in_XMM3_Dc;
  uint uVar16;
  float in_XMM3_Dd;
  uint uVar17;
  float fVar18;
  float fVar19;
  nk_size nStack_f0;
  nk_uint col [3];
  undefined4 uStack_cc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  nk_size local_a8;
  nk_vec2 pos_local;
  nk_uint local_98;
  nk_uint local_88;
  nk_vec2 uv_local;
  
  fVar12 = color.b;
  fVar14 = color.a;
  pnVar4 = config->vertex_layout;
  local_a8 = config->vertex_size;
  fVar6 = color.r;
  fVar9 = color.g;
  fVar10 = color.r;
  fVar11 = color.g;
  uVar13 = -(uint)(fVar6 <= 0.0 || 1.0 < fVar6);
  uVar15 = -(uint)(fVar9 <= 0.0 || 1.0 < fVar9);
  fVar18 = (float)(~uVar13 & (uint)fVar6 | -(uint)(0.0 < fVar6 || 1.0 < fVar6) & 0x3f800000 & uVar13
                  );
  fVar19 = (float)(~uVar15 & (uint)fVar9 | -(uint)(0.0 < fVar9 || 1.0 < fVar9) & 0x3f800000 & uVar15
                  );
  auVar7._0_4_ = (int)(fVar18 * 65535.0);
  auVar7._4_4_ = (int)(fVar19 * 65535.0);
  auVar7._8_4_ = (int)((float)(~-(uint)(fVar10 <= 0.0 || 0.0 < fVar10) & (uint)fVar10) * 0.0);
  auVar7._12_4_ = (int)((float)(~-(uint)(fVar11 <= 0.0 || 0.0 < fVar11) & (uint)fVar11) * 0.0);
  auVar7 = pshuflw(auVar7,auVar7,0xe8);
  uVar13 = -(uint)(fVar12 <= 0.0 || 1.0 < fVar12);
  uVar15 = -(uint)(fVar14 <= 0.0 || 1.0 < fVar14);
  fVar6 = (float)(~uVar13 & (uint)fVar12 |
                 -(uint)(0.0 < fVar12 || 1.0 < fVar12) & 0x3f800000 & uVar13);
  fVar9 = (float)(~uVar15 & (uint)fVar14 |
                 -(uint)(0.0 < fVar14 || 1.0 < fVar14) & 0x3f800000 & uVar15);
  uVar13 = (uint)(fVar18 * 4.2949673e+09);
  uVar15 = (uint)(fVar19 * 4.2949673e+09);
  uVar16 = (uint)(fVar6 * 4.2949673e+09);
  uVar17 = (uint)(fVar9 * 4.2949673e+09);
  uVar13 = (int)(fVar18 * 4.2949673e+09 - 2.1474836e+09) & (int)uVar13 >> 0x1f | uVar13;
  uVar15 = (int)(fVar19 * 4.2949673e+09 - 2.1474836e+09) & (int)uVar15 >> 0x1f | uVar15;
  uVar16 = (int)(fVar6 * 4.2949673e+09 - 2.1474836e+09) & (int)uVar16 >> 0x1f | uVar16;
  auVar8._0_4_ = fVar6 * 65535.0;
  auVar8._4_4_ = fVar9 * 65535.0;
  auVar8._8_4_ = (float)(~-(uint)(in_XMM3_Dc <= 0.0 || 0.0 < in_XMM3_Dc) & (uint)in_XMM3_Dc) * 0.0;
  auVar8._12_4_ = (float)(~-(uint)(in_XMM3_Dd <= 0.0 || 0.0 < in_XMM3_Dd) & (uint)in_XMM3_Dd) * 0.0;
  auVar5._0_4_ = (int)auVar8._0_4_;
  auVar5._4_4_ = (int)auVar8._4_4_;
  auVar5._8_4_ = (int)auVar8._8_4_;
  auVar5._12_4_ = (int)auVar8._12_4_;
  auVar8 = pshuflw(auVar8,auVar5,0xe8);
  pos_local = pos;
  uv_local = uv;
  do {
    nVar1 = pnVar4->attribute;
    if ((nVar1 == NK_VERTEX_ATTRIBUTE_COUNT) ||
       (value_count = pnVar4->format, value_count == NK_FORMAT_COUNT)) {
      return (void *)((long)dst + local_a8);
    }
    dst0 = (void *)(pnVar4->offset + (long)dst);
    if (nVar1 == NK_VERTEX_POSITION) {
      values = &pos_local;
LAB_00120deb:
      nk_draw_vertex_element(dst0,&values->x,value_count,(nk_draw_vertex_layout_format)in_RCX);
      goto LAB_00120ed0;
    }
    if (nVar1 != NK_VERTEX_COLOR) {
      values = &uv_local;
      if (nVar1 != NK_VERTEX_TEXCOORD) {
        __assert_fail("0 && \"wrong element attribute\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                      ,0x2537,
                      "void *nk_draw_vertex(void *, const struct nk_convert_config *, struct nk_vec2, struct nk_vec2, struct nk_colorf)"
                     );
      }
      goto LAB_00120deb;
    }
    if (value_count < NK_FORMAT_COLOR_BEGIN) {
      __assert_fail("format >= NK_FORMAT_COLOR_BEGIN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                    ,0x24b2,
                    "void nk_draw_vertex_color(void *, const float *, enum nk_draw_vertex_layout_format)"
                   );
    }
    if (NK_FORMAT_COLOR_END < value_count) {
      __assert_fail("format <= NK_FORMAT_COLOR_END",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                    ,0x24b3,
                    "void nk_draw_vertex_color(void *, const float *, enum nk_draw_vertex_layout_format)"
                   );
    }
    local_b8 = CONCAT44(fVar19,fVar18);
    uStack_b0 = CONCAT44(fVar9,fVar6);
    local_98 = auVar7._0_4_;
    pnVar3 = col;
    switch(value_count) {
    default:
      nVar2 = nk_rgba_fv((float *)&local_b8);
      goto LAB_00120dd2;
    case NK_FORMAT_R16G15B16:
      col[1]._0_2_ = (short)auVar5._0_4_;
      col[0] = local_98;
      nStack_f0 = 6;
      break;
    case NK_FORMAT_R32G32B32:
      col[1] = uVar15;
      col[0] = uVar13;
      stack0xffffffffffffff30 = (double)CONCAT44(uStack_cc,uVar16);
      nStack_f0 = 0xc;
      break;
    case NK_FORMAT_B8G8R8A8:
      nVar2 = nk_rgba_fv((float *)&local_b8);
      in_RCX = (ulong)((uint)nVar2 >> 0x18);
      nVar2 = nk_rgba((uint)nVar2 >> 0x10 & 0xff,(uint)nVar2 >> 8 & 0xff,(uint)nVar2 & 0xff,
                      (uint)nVar2 >> 0x18);
LAB_00120dd2:
      col[0]._0_1_ = nVar2.r;
      col[0]._1_1_ = nVar2.g;
      col[0]._2_1_ = nVar2.b;
      col[0]._3_1_ = nVar2.a;
      nStack_f0 = 4;
      break;
    case NK_FORMAT_R16G15B16A16:
      local_88 = auVar8._0_4_;
      col[1] = local_88;
      col[0] = local_98;
      nStack_f0 = 8;
      break;
    case NK_FORMAT_R32G32B32A32:
      col[1] = uVar15;
      col[0] = uVar13;
      unique0x10000430 =
           (double)CONCAT44((int)(fVar9 * 4.2949673e+09 - 2.1474836e+09) & (int)uVar17 >> 0x1f |
                            uVar17,uVar16);
      goto LAB_00120ea2;
    case NK_FORMAT_R32G32B32A32_FLOAT:
      pnVar3 = (nk_uint *)&local_b8;
LAB_00120ea2:
      nStack_f0 = 0x10;
      break;
    case NK_FORMAT_R32G32B32A32_DOUBLE:
      nStack_f0 = 0x20;
      col._0_8_ = (double)fVar18;
      unique0x1000055d = (double)fVar19;
    }
    nk_memcopy(dst0,pnVar3,nStack_f0);
LAB_00120ed0:
    pnVar4 = pnVar4 + 1;
  } while( true );
}

Assistant:

NK_INTERN void*
nk_draw_vertex(void *dst, const struct nk_convert_config *config,
    struct nk_vec2 pos, struct nk_vec2 uv, struct nk_colorf color)
{
    void *result = (void*)((char*)dst + config->vertex_size);
    const struct nk_draw_vertex_layout_element *elem_iter = config->vertex_layout;
    while (!nk_draw_vertex_layout_element_is_end_of_layout(elem_iter)) {
        void *address = (void*)((char*)dst + elem_iter->offset);
        switch (elem_iter->attribute) {
        case NK_VERTEX_ATTRIBUTE_COUNT:
        default: NK_ASSERT(0 && "wrong element attribute"); break;
        case NK_VERTEX_POSITION: nk_draw_vertex_element(address, &pos.x, 2, elem_iter->format); break;
        case NK_VERTEX_TEXCOORD: nk_draw_vertex_element(address, &uv.x, 2, elem_iter->format); break;
        case NK_VERTEX_COLOR: nk_draw_vertex_color(address, &color.r, elem_iter->format); break;
        }
        elem_iter++;
    }
    return result;
}